

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O1

bool __thiscall
CPubKey::RecoverCompact
          (CPubKey *this,uint256 *hash,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig
          )

{
  uchar uVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  size_t publen;
  uchar pub [65];
  secp256k1_ecdsa_recoverable_signature sig;
  secp256k1_pubkey pubkey;
  size_t local_100;
  uchar local_f8 [79];
  secp256k1_ecdsa_recoverable_signature local_a9;
  secp256k1_pubkey local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(vchSig->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar2 == 0x41) {
    uVar1 = *puVar2;
    iVar4 = secp256k1_ecdsa_recoverable_signature_parse_compact
                      (secp256k1_context_static,&local_a9,puVar2 + 1,(uint)(uVar1 + 1 & 3));
    if (iVar4 != 0) {
      iVar4 = secp256k1_ecdsa_recover(secp256k1_context_static,&local_68,&local_a9,(uchar *)hash);
      if (iVar4 != 0) {
        local_100 = 0x41;
        secp256k1_ec_pubkey_serialize
                  (secp256k1_context_static,local_f8,&local_100,&local_68,
                   (uint)((uVar1 + 5 & 4) >> 2) << 8 | 2);
        Set<unsigned_char*>(this,local_f8,local_f8 + local_100);
        bVar3 = true;
        goto LAB_0041c772;
      }
    }
  }
  bVar3 = false;
LAB_0041c772:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::RecoverCompact(const uint256 &hash, const std::vector<unsigned char>& vchSig) {
    if (vchSig.size() != COMPACT_SIGNATURE_SIZE)
        return false;
    int recid = (vchSig[0] - 27) & 3;
    bool fComp = ((vchSig[0] - 27) & 4) != 0;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_recoverable_signature sig;
    if (!secp256k1_ecdsa_recoverable_signature_parse_compact(secp256k1_context_static, &sig, &vchSig[1], recid)) {
        return false;
    }
    if (!secp256k1_ecdsa_recover(secp256k1_context_static, &pubkey, &sig, hash.begin())) {
        return false;
    }
    unsigned char pub[SIZE];
    size_t publen = SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, fComp ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED);
    Set(pub, pub + publen);
    return true;
}